

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::Annotate<google::protobuf::Descriptor>
          (Printer *this,char *begin_varname,char *end_varname,Descriptor *descriptor)

{
  FileDescriptor *this_00;
  string *file_path;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> path;
  Descriptor *descriptor_local;
  char *end_varname_local;
  char *begin_varname_local;
  Printer *this_local;
  
  if (this->annotation_collector_ != (AnnotationCollector *)0x0) {
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)descriptor;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
    Descriptor::GetLocationPath
              ((Descriptor *)
               path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_40);
    this_00 = Descriptor::file((Descriptor *)
                               path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
    file_path = FileDescriptor::name_abi_cxx11_(this_00);
    Annotate(this,begin_varname,end_varname,file_path,(vector<int,_std::allocator<int>_> *)local_40)
    ;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  }
  return;
}

Assistant:

void Annotate(const char* begin_varname, const char* end_varname,
                const SomeDescriptor* descriptor) {
    if (annotation_collector_ == NULL) {
      // Annotations aren't turned on for this Printer, so don't pay the cost
      // of building the location path.
      return;
    }
    std::vector<int> path;
    descriptor->GetLocationPath(&path);
    Annotate(begin_varname, end_varname, descriptor->file()->name(), path);
  }